

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

unsigned_long bloaty::ReadFixed<unsigned_long,8ul>(string_view *data)

{
  unsigned_long uVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  char *unaff_retaddr;
  unsigned_long val;
  
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RDI);
  if (sVar2 < 8) {
    Throw(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  }
  puVar3 = (unsigned_long *)std::basic_string_view<char,_std::char_traits<char>_>::data(in_RDI);
  uVar1 = *puVar3;
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(in_RDI,8);
  return uVar1;
}

Assistant:

T ReadFixed(std::string_view *data) {
  static_assert(N <= sizeof(T), "N too big for this data type");
  T val = 0;
  if (data->size() < N) {
    THROW("premature EOF reading fixed-length data");
  }
  memcpy(&val, data->data(), N);
  data->remove_prefix(N);
  return val;
}